

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.cpp
# Opt level: O0

void __thiscall
boost::deflate::deflate_stream_test::doMatrix
          (deflate_stream_test *this,ICompressor *c,string *check,pmf_t pmf)

{
  long *plVar1;
  long in_R8;
  code *local_88;
  code *local_70;
  int local_50;
  int local_4c;
  int memLevel;
  int strategy;
  int windowBits;
  int level;
  pmf_t pmf_local;
  string *check_local;
  ICompressor *c_local;
  deflate_stream_test *this_local;
  
  for (strategy = 0; strategy < 10; strategy = strategy + 1) {
    for (memLevel = 8; memLevel < 10; memLevel = memLevel + 1) {
      if (memLevel != 8) {
        for (local_4c = 0; local_4c < 5; local_4c = local_4c + 1) {
          for (local_50 = 8; local_50 < 10; local_50 = local_50 + 1) {
            plVar1 = (long *)((long)&(this->zlib_compressor).super_ICompressor._vptr_ICompressor +
                             in_R8);
            local_70 = (code *)pmf;
            if ((pmf & 1) != 0) {
              local_70 = *(code **)(*plVar1 + (pmf - 1));
            }
            (*local_70)(plVar1,c,strategy,memLevel,local_50,local_4c,check);
          }
        }
      }
    }
  }
  plVar1 = (long *)((long)&(this->zlib_compressor).super_ICompressor._vptr_ICompressor + in_R8);
  local_88 = (code *)pmf;
  if ((pmf & 1) != 0) {
    local_88 = *(code **)(*plVar1 + (pmf - 1));
  }
  (*local_88)(plVar1,c,0xffffffff,0xf,8,0,check);
  return;
}

Assistant:

void doMatrix(ICompressor& c, std::string const& check, pmf_t pmf)
    {
        for(int level = 0; level <= 9; ++level)
        {
            for(int windowBits = 8; windowBits <= 9; ++windowBits)
            {
                // zlib has a bug with windowBits==8
                if(windowBits == 8)
                    continue;
                for(int strategy = 0; strategy <= 4; ++strategy)
                {
                    for (int memLevel = 8; memLevel <= 9; ++memLevel)
                    {
                        (this->*pmf)(
                            c, level, windowBits, memLevel, strategy, check);
                    }
                }
            }
        }

        // Check default settings
        (this->*pmf)(c, compression::default_size, 15, 8, 0, check);
    }